

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_connect(connectdata *conn,_Bool *done)

{
  char *value;
  saslstate *sasl;
  char cVar1;
  int iVar2;
  CURLcode CVar3;
  char *pcVar4;
  size_t len;
  char *pcVar5;
  char localhost [1025];
  char local_438 [1032];
  
  *done = false;
  CVar3 = CURLE_OK;
  Curl_conncontrol(conn,0);
  (conn->proto).ftpc.pp.response_time = 120000;
  (conn->proto).ftpc.pp.statemach_act = smtp_statemach_act;
  (conn->proto).ftpc.pp.endofresp = smtp_endofresp;
  (conn->proto).ftpc.pp.conn = conn;
  sasl = &(conn->proto).imapc.sasl.state;
  Curl_sasl_init((SASL *)sasl,&saslsmtp);
  Curl_pp_init(&(conn->proto).ftpc.pp);
  pcVar5 = conn->options;
  (conn->proto).ftpc.cwdfail = true;
  if (pcVar5 != (char *)0x0) {
    cVar1 = *pcVar5;
    CVar3 = CURLE_OK;
    while (pcVar4 = pcVar5, cVar1 != '\0') {
      for (; (*pcVar4 != '\0' && (*pcVar4 != '=')); pcVar4 = pcVar4 + 1) {
      }
      value = pcVar4 + 1;
      len = 0xffffffffffffffff;
      for (; (*pcVar4 != '\0' && (*pcVar4 != ';')); pcVar4 = pcVar4 + 1) {
        len = len + 1;
      }
      iVar2 = Curl_strncasecompare(pcVar5,"AUTH=",5);
      if (iVar2 == 0) {
        CVar3 = CURLE_URL_MALFORMAT;
      }
      else {
        CVar3 = Curl_sasl_parse_url_auth_option((SASL *)sasl,value,len);
      }
      if (CVar3 != CURLE_OK) break;
      pcVar5 = pcVar4 + (*pcVar4 == ';');
      cVar1 = pcVar4[*pcVar4 == ';'];
    }
  }
  if (CVar3 == CURLE_OK) {
    pcVar5 = (conn->data->state).up.path;
    if (pcVar5[1] == '\0') {
      iVar2 = Curl_gethostname(local_438,0x401);
      pcVar5 = "localhost";
      if (iVar2 == 0) {
        pcVar5 = local_438;
      }
    }
    else {
      pcVar5 = pcVar5 + 1;
    }
    CVar3 = Curl_urldecode(conn->data,pcVar5,0,&(conn->proto).sshc.readdir_linkPath,(size_t *)0x0,
                           true);
    if (CVar3 == CURLE_OK) {
      (conn->proto).imapc.state = IMAP_SERVERGREET;
      CVar3 = smtp_multi_statemach(conn,done);
    }
  }
  return CVar3;
}

Assistant:

static CURLcode smtp_connect(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  struct pingpong *pp = &smtpc->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in SMTP */
  connkeep(conn, "SMTP default");

  /* Set the default response time-out */
  pp->response_time = RESP_TIMEOUT;
  pp->statemach_act = smtp_statemach_act;
  pp->endofresp = smtp_endofresp;
  pp->conn = conn;

  /* Initialize the SASL storage */
  Curl_sasl_init(&smtpc->sasl, &saslsmtp);

  /* Initialise the pingpong layer */
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = smtp_parse_url_options(conn);
  if(result)
    return result;

  /* Parse the URL path */
  result = smtp_parse_url_path(conn);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  state(conn, SMTP_SERVERGREET);

  result = smtp_multi_statemach(conn, done);

  return result;
}